

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns::dump_block_parameters_storage
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int *err,FILE *F_out)

{
  byte bVar1;
  char *__ptr;
  byte *in_00;
  uint8_t *in_01;
  int iVar2;
  int64_t val;
  int64_t inner_val;
  char *p_out;
  int64_t local_40;
  char *local_38;
  char *local_30;
  
  bVar1 = *in;
  local_38 = out_buf;
  local_30 = out_max;
  in_00 = cbor_get_number(in,in_max,&val);
  if (bVar1 >> 5 == 5 && in_00 != (byte *)0x0) {
    fwrite("[\n",2,1,(FILE *)F_out);
    local_40 = val;
    if (val == -1) {
      val = 0xffffffff;
    }
    iVar2 = 0;
    while (((in_00 < in_max && (in_00 != (byte *)0x0)) && (0 < val))) {
      bVar1 = *in_00;
      if (bVar1 == 0xff) {
        if (local_40 == -1) {
          in_00 = in_00 + 1;
          goto LAB_0015a764;
        }
        fwrite("                    Error, end of array mark unexpected.\n",0x39,1,(FILE *)F_out);
        *err = -3;
        goto LAB_0015a75d;
      }
      in_01 = cbor_get_number(in_00,in_max,&inner_val);
      if (bVar1 < 0x20) {
        if (iVar2 != 0) {
          fwrite(",\n",2,1,(FILE *)F_out);
        }
        __ptr = local_38;
        iVar2 = iVar2 + 1;
        p_out = local_38;
        fprintf((FILE *)F_out,"                    %d,",(ulong)(uint)inner_val);
        in_00 = cbor_to_text(in_01,in_max,&p_out,local_30,err);
        fwrite(__ptr,1,(long)p_out - (long)__ptr,(FILE *)F_out);
        val = val + -1;
      }
      else {
        fprintf((FILE *)F_out,"                    Unexpected type: %d(%d)\n",(ulong)(bVar1 >> 5),
                (ulong)(uint)inner_val);
        *err = -3;
        in_00 = (byte *)0x0;
      }
    }
    if (in_00 == (byte *)0x0) {
LAB_0015a75d:
      in_00 = (byte *)0x0;
    }
    else {
LAB_0015a764:
      fwrite("\n                ]",0x12,1,(FILE *)F_out);
    }
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,
            "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n",
            (ulong)(bVar1 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_parameters_storage(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP) {
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "                    Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "                    Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies from RFC */
                        p_out = out_buf;
                        fprintf(F_out, "                    %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n                ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of storage parameters (RFC), type %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}